

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O2

sqlite3_int64 integerValue(char *zArg)

{
  byte *pbVar1;
  char cVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  byte *zRight;
  long lVar8;
  
  cVar2 = *zArg;
  zRight = (byte *)(zArg + ((cVar2 - 0x2bU & 0xfd) == 0));
  bVar3 = *zRight;
  if ((bVar3 == 0x30) && (zRight[1] == 0x78)) {
    zRight = zRight + 2;
    lVar8 = 0;
    while( true ) {
      uVar4 = hexDigitValue(*zRight);
      if ((int)uVar4 < 0) break;
      lVar8 = lVar8 * 0x10 + (ulong)uVar4;
      zRight = zRight + 1;
    }
  }
  else {
    lVar8 = 0;
    while (bVar3 - 0x30 < 10) {
      lVar8 = lVar8 * 10 + (long)(char)bVar3 + -0x30;
      pbVar1 = zRight + 1;
      zRight = zRight + 1;
      bVar3 = *pbVar1;
    }
  }
  lVar6 = 0;
  do {
    lVar7 = lVar6;
    if (lVar7 + 0x10 == 0xa0) goto LAB_001e3625;
    iVar5 = duckdb_shell_sqlite3_stricmp
                      (*(char **)((long)&integerValue::aMult[0].zSuffix + lVar7),(char *)zRight);
    lVar6 = lVar7 + 0x10;
  } while (iVar5 != 0);
  lVar8 = lVar8 * *(int *)((long)&integerValue::aMult[0].iMult + lVar7);
LAB_001e3625:
  lVar6 = -lVar8;
  if (cVar2 != '-') {
    lVar6 = lVar8;
  }
  return lVar6;
}

Assistant:

static sqlite3_int64 integerValue(const char *zArg) {
	sqlite3_int64 v = 0;
	static const struct {
		const char *zSuffix;
		int iMult;
	} aMult[] = {
	    {"KiB", 1024}, {"MiB", 1024 * 1024}, {"GiB", 1024 * 1024 * 1024},
	    {"KB", 1000},  {"MB", 1000000},      {"GB", 1000000000},
	    {"K", 1000},   {"M", 1000000},       {"G", 1000000000},
	};
	int i;
	int isNeg = 0;
	if (zArg[0] == '-') {
		isNeg = 1;
		zArg++;
	} else if (zArg[0] == '+') {
		zArg++;
	}
	if (zArg[0] == '0' && zArg[1] == 'x') {
		int x;
		zArg += 2;
		while ((x = hexDigitValue(zArg[0])) >= 0) {
			v = (v << 4) + x;
			zArg++;
		}
	} else {
		while (IsDigit(zArg[0])) {
			v = v * 10 + zArg[0] - '0';
			zArg++;
		}
	}
	for (i = 0; i < ArraySize(aMult); i++) {
		if (sqlite3_stricmp(aMult[i].zSuffix, zArg) == 0) {
			v *= aMult[i].iMult;
			break;
		}
	}
	return isNeg ? -v : v;
}